

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O3

int __thiscall webrtc::EchoCancellationImpl::GetMetrics(EchoCancellationImpl *this,Metrics *metrics)

{
  int iVar1;
  int iVar2;
  CritScope cs;
  AecMetrics my_metrics;
  CritScope local_70;
  AecMetrics local_68;
  
  rtc::CritScope::CritScope(&local_70,this->crit_capture_);
  if (metrics == (Metrics *)0x0) {
    iVar2 = -5;
  }
  else {
    iVar2 = -0xc;
    if ((this->enabled_ == true) && (this->metrics_enabled_ == true)) {
      local_68.divergent_filter_fraction = 0.0;
      local_68.aNlp.instant = 0;
      local_68.aNlp.average = 0;
      local_68.aNlp.max = 0;
      local_68.aNlp.min = 0;
      local_68.erle.instant = 0;
      local_68.erle.average = 0;
      local_68.erle.max = 0;
      local_68.erle.min = 0;
      local_68.erl.instant = 0;
      local_68.erl.average = 0;
      local_68.erl.max = 0;
      local_68.erl.min = 0;
      local_68.rerl.instant = 0;
      local_68.rerl.average = 0;
      local_68.rerl.max = 0;
      local_68.rerl.min = 0;
      metrics->divergent_filter_fraction = 0.0;
      (metrics->a_nlp).instant = 0;
      (metrics->a_nlp).average = 0;
      (metrics->a_nlp).maximum = 0;
      (metrics->a_nlp).minimum = 0;
      (metrics->echo_return_loss_enhancement).instant = 0;
      (metrics->echo_return_loss_enhancement).average = 0;
      (metrics->echo_return_loss_enhancement).maximum = 0;
      (metrics->echo_return_loss_enhancement).minimum = 0;
      (metrics->echo_return_loss).instant = 0;
      (metrics->echo_return_loss).average = 0;
      (metrics->echo_return_loss).maximum = 0;
      (metrics->echo_return_loss).minimum = 0;
      (metrics->residual_echo_return_loss).instant = 0;
      (metrics->residual_echo_return_loss).average = 0;
      (metrics->residual_echo_return_loss).maximum = 0;
      (metrics->residual_echo_return_loss).minimum = 0;
      iVar1 = WebRtcAec_GetMetrics
                        (*(void **)(((this->cancellers_).
                                     super__Vector_base<std::unique_ptr<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<webrtc::EchoCancellationImpl::Canceller,_std::default_delete<webrtc::EchoCancellationImpl::Canceller>_>
                                   ._M_t,&local_68);
      if (iVar1 < 0x2ee4) {
        if (iVar1 == 0) {
          (metrics->residual_echo_return_loss).instant = local_68.rerl.instant;
          (metrics->residual_echo_return_loss).average = local_68.rerl.average;
          (metrics->residual_echo_return_loss).maximum = local_68.rerl.max;
          (metrics->residual_echo_return_loss).minimum = local_68.rerl.min;
          (metrics->echo_return_loss).instant = local_68.erl.instant;
          (metrics->echo_return_loss).average = local_68.erl.average;
          (metrics->echo_return_loss).maximum = local_68.erl.max;
          (metrics->echo_return_loss).minimum = local_68.erl.min;
          (metrics->echo_return_loss_enhancement).instant = local_68.erle.instant;
          (metrics->echo_return_loss_enhancement).average = local_68.erle.average;
          (metrics->echo_return_loss_enhancement).maximum = local_68.erle.max;
          (metrics->echo_return_loss_enhancement).minimum = local_68.erle.min;
          (metrics->a_nlp).instant = local_68.aNlp.instant;
          (metrics->a_nlp).average = local_68.aNlp.average;
          (metrics->a_nlp).maximum = local_68.aNlp.max;
          (metrics->a_nlp).minimum = local_68.aNlp.min;
          metrics->divergent_filter_fraction = local_68.divergent_filter_fraction;
          iVar2 = 0;
          goto LAB_00178a4f;
        }
        iVar2 = -4;
        if (iVar1 == 0x2ee1) goto LAB_00178a4f;
      }
      else {
        if (iVar1 == 0x2f12) {
          iVar2 = -0xd;
          goto LAB_00178a4f;
        }
        if (iVar1 == 0x2ee4) {
          iVar2 = -6;
          goto LAB_00178a4f;
        }
      }
      iVar2 = -1;
    }
  }
LAB_00178a4f:
  rtc::CritScope::~CritScope(&local_70);
  return iVar2;
}

Assistant:

int EchoCancellationImpl::GetMetrics(Metrics* metrics) {
  rtc::CritScope cs(crit_capture_);
  if (metrics == NULL) {
    return AudioProcessing::kNullPointerError;
  }

  if (!enabled_ || !metrics_enabled_) {
    return AudioProcessing::kNotEnabledError;
  }

  AecMetrics my_metrics;
  memset(&my_metrics, 0, sizeof(my_metrics));
  memset(metrics, 0, sizeof(Metrics));

  const int err = WebRtcAec_GetMetrics(cancellers_[0]->state(), &my_metrics);
  if (err != AudioProcessing::kNoError) {
    return MapError(err);
  }

  metrics->residual_echo_return_loss.instant = my_metrics.rerl.instant;
  metrics->residual_echo_return_loss.average = my_metrics.rerl.average;
  metrics->residual_echo_return_loss.maximum = my_metrics.rerl.max;
  metrics->residual_echo_return_loss.minimum = my_metrics.rerl.min;

  metrics->echo_return_loss.instant = my_metrics.erl.instant;
  metrics->echo_return_loss.average = my_metrics.erl.average;
  metrics->echo_return_loss.maximum = my_metrics.erl.max;
  metrics->echo_return_loss.minimum = my_metrics.erl.min;

  metrics->echo_return_loss_enhancement.instant = my_metrics.erle.instant;
  metrics->echo_return_loss_enhancement.average = my_metrics.erle.average;
  metrics->echo_return_loss_enhancement.maximum = my_metrics.erle.max;
  metrics->echo_return_loss_enhancement.minimum = my_metrics.erle.min;

  metrics->a_nlp.instant = my_metrics.aNlp.instant;
  metrics->a_nlp.average = my_metrics.aNlp.average;
  metrics->a_nlp.maximum = my_metrics.aNlp.max;
  metrics->a_nlp.minimum = my_metrics.aNlp.min;

  metrics->divergent_filter_fraction = my_metrics.divergent_filter_fraction;
  return AudioProcessing::kNoError;
}